

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O0

void slab_poison(slab *slab)

{
  void *__s;
  size_t __n;
  unsigned_long _zzq_result_1;
  unsigned_long _zzq_args_1 [6];
  char poison_char;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  slab *slab_local;
  
  slab_data(slab);
  slab_capacity(slab);
  __s = slab_data(slab);
  __n = slab_capacity(slab);
  memset(__s,0x50,__n);
  slab_data(slab);
  slab_capacity(slab);
  return;
}

Assistant:

static inline void
slab_poison(struct slab *slab)
{
	(void)slab;
#ifndef NDEBUG
	VALGRIND_MAKE_MEM_UNDEFINED(slab_data(slab), slab_capacity(slab));
	const char poison_char = 'P';
	memset(slab_data(slab), poison_char, slab_capacity(slab));
#endif
	VALGRIND_MAKE_MEM_NOACCESS(slab_data(slab), slab_capacity(slab));
}